

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_type_parser_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  exception *e;
  ostringstream oss_38;
  ostringstream oss_37;
  ostringstream oss_36;
  ostringstream oss_35;
  content_type t_8;
  ostringstream oss_34;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  content_type t_7;
  ostringstream oss_30;
  ostringstream oss_29;
  ostringstream oss_28;
  content_type t_6;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  content_type t_5;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  content_type t_4;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  content_type t_3;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  content_type t_2;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  content_type t_1;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  content_type t;
  char *in_stack_ffffffffffffb288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb290;
  string local_45c0 [32];
  ostringstream local_45a0 [376];
  string local_4428 [39];
  undefined1 local_4401;
  string local_4400 [32];
  ostringstream local_43e0 [376];
  string local_4268 [39];
  undefined1 local_4241;
  string local_4240 [32];
  ostringstream local_4220 [376];
  string local_40a8 [39];
  undefined1 local_4081;
  string local_4080 [32];
  ostringstream local_4060 [376];
  string local_3ee8 [32];
  content_type local_3ec8 [23];
  undefined1 local_3eb1;
  string local_3eb0 [32];
  ostringstream local_3e90 [376];
  string local_3d18 [39];
  undefined1 local_3cf1;
  string local_3cf0 [32];
  ostringstream local_3cd0 [376];
  string local_3b58 [39];
  undefined1 local_3b31;
  string local_3b30 [32];
  ostringstream local_3b10 [376];
  string local_3998 [39];
  undefined1 local_3971;
  string local_3970 [32];
  ostringstream local_3950 [376];
  string local_37d8 [32];
  content_type local_37b8 [23];
  undefined1 local_37a1;
  string local_37a0 [32];
  ostringstream local_3780 [376];
  string local_3608 [39];
  undefined1 local_35e1;
  string local_35e0 [32];
  ostringstream local_35c0 [376];
  string local_3448 [39];
  undefined1 local_3421;
  string local_3420 [32];
  ostringstream local_3400 [376];
  string local_3288 [32];
  content_type local_3268 [23];
  undefined1 local_3251;
  string local_3250 [32];
  ostringstream local_3230 [376];
  string local_30b8 [39];
  undefined1 local_3091;
  string local_3090 [32];
  ostringstream local_3070 [376];
  string local_2ef8 [39];
  undefined1 local_2ed1;
  string local_2ed0 [32];
  ostringstream local_2eb0 [376];
  string local_2d38 [32];
  content_type local_2d18 [23];
  undefined1 local_2d01;
  string local_2d00 [32];
  ostringstream local_2ce0 [376];
  string local_2b68 [39];
  undefined1 local_2b41;
  string local_2b40 [32];
  ostringstream local_2b20 [376];
  string local_29a8 [39];
  undefined1 local_2981;
  string local_2980 [32];
  ostringstream local_2960 [376];
  string local_27e8 [32];
  content_type local_27c8 [23];
  undefined1 local_27b1;
  string local_27b0 [32];
  ostringstream local_2790 [383];
  allocator local_2611;
  string local_2610 [32];
  string local_25f0 [39];
  undefined1 local_25c9;
  string local_25c8 [32];
  ostringstream local_25a8 [383];
  allocator local_2429;
  string local_2428 [32];
  string local_2408 [39];
  undefined1 local_23e1;
  string local_23e0 [32];
  ostringstream local_23c0 [383];
  allocator local_2241;
  string local_2240 [32];
  string local_2220 [39];
  undefined1 local_21f9;
  string local_21f8 [32];
  ostringstream local_21d8 [383];
  allocator local_2059;
  string local_2058 [32];
  string local_2038 [39];
  undefined1 local_2011;
  string local_2010 [32];
  ostringstream local_1ff0 [383];
  allocator local_1e71;
  string local_1e70 [32];
  string local_1e50 [39];
  undefined1 local_1e29;
  string local_1e28 [32];
  ostringstream local_1e08 [376];
  string local_1c90 [39];
  undefined1 local_1c69;
  string local_1c68 [32];
  ostringstream local_1c48 [376];
  string local_1ad0 [39];
  undefined1 local_1aa9;
  string local_1aa8 [32];
  ostringstream local_1a88 [376];
  string local_1910 [32];
  content_type local_18f0 [23];
  undefined1 local_18d9;
  string local_18d8 [32];
  ostringstream local_18b8 [383];
  allocator local_1739;
  string local_1738 [39];
  undefined1 local_1711;
  string local_1710 [32];
  ostringstream local_16f0 [376];
  string local_1578 [39];
  undefined1 local_1551;
  string local_1550 [32];
  ostringstream local_1530 [376];
  string local_13b8 [39];
  undefined1 local_1391;
  string local_1390 [32];
  ostringstream local_1370 [376];
  string local_11f8 [39];
  undefined1 local_11d1;
  string local_11d0 [32];
  ostringstream local_11b0 [376];
  string local_1038 [32];
  content_type local_1018 [23];
  undefined1 local_1001;
  string local_1000 [32];
  ostringstream local_fe0 [376];
  string local_e68 [39];
  undefined1 local_e41;
  string local_e40 [32];
  ostringstream local_e20 [383];
  allocator local_ca1;
  string local_ca0 [39];
  undefined1 local_c79;
  string local_c78 [32];
  ostringstream local_c58 [383];
  allocator local_ad9;
  string local_ad8 [39];
  undefined1 local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [376];
  string local_918 [39];
  undefined1 local_8f1;
  string local_8f0 [32];
  ostringstream local_8d0 [376];
  string local_758 [39];
  undefined1 local_731;
  string local_730 [32];
  ostringstream local_710 [376];
  string local_598 [32];
  content_type local_578 [23];
  undefined1 local_561;
  string local_560 [32];
  ostringstream local_540 [376];
  string local_3c8 [39];
  undefined1 local_3a1;
  string local_3a0 [32];
  ostringstream local_380 [376];
  string local_208 [39];
  undefined1 local_1e1;
  string local_1e0 [32];
  ostringstream local_1c0 [376];
  string local_48 [48];
  content_type local_18 [20];
  undefined4 local_4;
  
  local_4 = 0;
  cppcms::http::content_type::content_type(local_18,"hello/world");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_48);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x15);
    std::operator<<(poVar3," t.type()==\"hello\"");
    local_1e1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1e0);
    local_1e1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_208);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar3 = std::operator<<((ostream *)local_380,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
    std::operator<<(poVar3," t.subtype()==\"world\"");
    local_3a1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3a0);
    local_3a1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3c8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    poVar3 = std::operator<<((ostream *)local_540,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
    std::operator<<(poVar3," t.media_type()==\"hello/world\"");
    local_561 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_560);
    local_561 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_18);
  cppcms::http::content_type::content_type(local_578,"Hello/WORLD; chaRset=UTF-8");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_598);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_710);
    poVar3 = std::operator<<((ostream *)local_710,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b);
    std::operator<<(poVar3," t.type()==\"hello\"");
    local_731 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_730);
    local_731 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_758);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_8d0);
    poVar3 = std::operator<<((ostream *)local_8d0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c);
    std::operator<<(poVar3," t.subtype()==\"world\"");
    local_8f1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_8f0);
    local_8f1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_918);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_a90);
    poVar3 = std::operator<<((ostream *)local_a90,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d);
    std::operator<<(poVar3," t.media_type()==\"hello/world\"");
    local_ab1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_ab0);
    local_ab1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"charset",&local_ad9);
  bVar2 = cppcms::http::content_type::parameter_is_set((string *)local_578);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_c58);
    poVar3 = std::operator<<((ostream *)local_c58,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1e);
    std::operator<<(poVar3," t.parameter_is_set(\"charset\")");
    local_c79 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_c78);
    local_c79 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca0,"xx",&local_ca1);
  bVar2 = cppcms::http::content_type::parameter_is_set((string *)local_578);
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_e20);
    poVar3 = std::operator<<((ostream *)local_e20,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1f);
    std::operator<<(poVar3," !t.parameter_is_set(\"xx\")");
    local_e41 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_e40);
    local_e41 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::charset_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_e68);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_fe0);
    poVar3 = std::operator<<((ostream *)local_fe0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
    std::operator<<(poVar3," t.charset()==\"UTF-8\"");
    local_1001 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1000);
    local_1001 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_578);
  cppcms::http::content_type::content_type(local_1018,"hello/world ; chaRset=\"UTF-8\"");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1038);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_11b0);
    poVar3 = std::operator<<((ostream *)local_11b0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
    std::operator<<(poVar3," t.type()==\"hello\"");
    local_11d1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_11d0);
    local_11d1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_11f8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1370);
    poVar3 = std::operator<<((ostream *)local_1370,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
    std::operator<<(poVar3," t.subtype()==\"world\"");
    local_1391 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1390);
    local_1391 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_13b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1530);
    poVar3 = std::operator<<((ostream *)local_1530,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x26);
    std::operator<<(poVar3," t.media_type()==\"hello/world\"");
    local_1551 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1550);
    local_1551 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::charset_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1578);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_16f0);
    poVar3 = std::operator<<((ostream *)local_16f0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
    std::operator<<(poVar3," t.charset()==\"UTF-8\"");
    local_1711 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1710);
    local_1711 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1738,"charset",&local_1739);
  bVar2 = cppcms::http::content_type::parameter_is_set((string *)local_1018);
  std::__cxx11::string::~string(local_1738);
  std::allocator<char>::~allocator((allocator<char> *)&local_1739);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_18b8);
    poVar3 = std::operator<<((ostream *)local_18b8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
    std::operator<<(poVar3," t.parameter_is_set(\"charset\")");
    local_18d9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_18d8);
    local_18d9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_1018);
  cppcms::http::content_type::content_type
            (local_18f0,"hello/world; foo=1; bar=2; beep=\"x\\\"\"; zee=hello");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1910);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a88);
    poVar3 = std::operator<<((ostream *)local_1a88,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2c);
    std::operator<<(poVar3," t.type()==\"hello\"");
    local_1aa9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1aa8);
    local_1aa9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1ad0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c48);
    poVar3 = std::operator<<((ostream *)local_1c48,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d);
    std::operator<<(poVar3," t.subtype()==\"world\"");
    local_1c69 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1c68);
    local_1c69 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1c90);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e08);
    poVar3 = std::operator<<((ostream *)local_1e08,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2e);
    std::operator<<(poVar3," t.media_type()==\"hello/world\"");
    local_1e29 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1e28);
    local_1e29 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e70,"foo",&local_1e71);
  cppcms::http::content_type::parameter_by_key(local_1e50);
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_1e50);
  std::__cxx11::string::~string(local_1e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e71);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1ff0);
    poVar3 = std::operator<<((ostream *)local_1ff0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2f);
    std::operator<<(poVar3," t.parameter_by_key(\"foo\")==\"1\"");
    local_2011 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2010);
    local_2011 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2058,"bar",&local_2059);
  cppcms::http::content_type::parameter_by_key(local_2038);
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2038);
  std::__cxx11::string::~string(local_2058);
  std::allocator<char>::~allocator((allocator<char> *)&local_2059);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_21d8);
    poVar3 = std::operator<<((ostream *)local_21d8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30);
    std::operator<<(poVar3," t.parameter_by_key(\"bar\")==\"2\"");
    local_21f9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_21f8);
    local_21f9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2240,"beep",&local_2241);
  cppcms::http::content_type::parameter_by_key(local_2220);
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2220);
  std::__cxx11::string::~string(local_2240);
  std::allocator<char>::~allocator((allocator<char> *)&local_2241);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_23c0);
    poVar3 = std::operator<<((ostream *)local_23c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x31);
    std::operator<<(poVar3," t.parameter_by_key(\"beep\")==\"x\\\"\"");
    local_23e1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_23e0);
    local_23e1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2428,"zee",&local_2429);
  cppcms::http::content_type::parameter_by_key(local_2408);
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2408);
  std::__cxx11::string::~string(local_2428);
  std::allocator<char>::~allocator((allocator<char> *)&local_2429);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_25a8);
    poVar3 = std::operator<<((ostream *)local_25a8,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x32);
    std::operator<<(poVar3," t.parameter_by_key(\"zee\")==\"hello\"");
    local_25c9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_25c8);
    local_25c9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2610,"x",&local_2611);
  cppcms::http::content_type::parameter_by_key(local_25f0);
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_25f0);
  std::__cxx11::string::~string(local_2610);
  std::allocator<char>::~allocator((allocator<char> *)&local_2611);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2790);
    poVar3 = std::operator<<((ostream *)local_2790,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
    std::operator<<(poVar3," t.parameter_by_key(\"x\")==\"\"");
    local_27b1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_27b0);
    local_27b1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_18f0);
  cppcms::http::content_type::content_type(local_27c8,"foo");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_27e8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2960);
    poVar3 = std::operator<<((ostream *)local_2960,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x37);
    std::operator<<(poVar3," t.type()==\"\"");
    local_2981 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2980);
    local_2981 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_29a8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2b20);
    poVar3 = std::operator<<((ostream *)local_2b20,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
    std::operator<<(poVar3," t.subtype()==\"\"");
    local_2b41 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2b40);
    local_2b41 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2b68);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2ce0);
    poVar3 = std::operator<<((ostream *)local_2ce0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x39);
    std::operator<<(poVar3," t.media_type()==\"\"");
    local_2d01 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2d00);
    local_2d01 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_27c8);
  cppcms::http::content_type::content_type(local_2d18,"foo/");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2d38);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2eb0);
    poVar3 = std::operator<<((ostream *)local_2eb0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3d);
    std::operator<<(poVar3," t.type()==\"\"");
    local_2ed1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2ed0);
    local_2ed1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_2ef8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3070);
    poVar3 = std::operator<<((ostream *)local_3070,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3e);
    std::operator<<(poVar3," t.subtype()==\"\"");
    local_3091 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3090);
    local_3091 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_30b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3230);
    poVar3 = std::operator<<((ostream *)local_3230,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
    std::operator<<(poVar3," t.media_type()==\"\"");
    local_3251 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3250);
    local_3251 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_2d18);
  cppcms::http::content_type::content_type(local_3268,"/foo");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3288);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3400);
    poVar3 = std::operator<<((ostream *)local_3400,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x43);
    std::operator<<(poVar3," t.type()==\"\"");
    local_3421 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3420);
    local_3421 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3448);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_35c0);
    poVar3 = std::operator<<((ostream *)local_35c0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44);
    std::operator<<(poVar3," t.subtype()==\"\"");
    local_35e1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_35e0);
    local_35e1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3608);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3780);
    poVar3 = std::operator<<((ostream *)local_3780,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x45);
    std::operator<<(poVar3," t.media_type()==\"\"");
    local_37a1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_37a0);
    local_37a1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_3268);
  cppcms::http::content_type::content_type(local_37b8,"foo/bar;; charset=UTF-8");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_37d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3950);
    poVar3 = std::operator<<((ostream *)local_3950,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x49);
    std::operator<<(poVar3," t.type()==\"foo\"");
    local_3971 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3970);
    local_3971 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3998);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3b10);
    poVar3 = std::operator<<((ostream *)local_3b10,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
    std::operator<<(poVar3," t.subtype()==\"bar\"");
    local_3b31 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3b30);
    local_3b31 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3b58);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3cd0);
    poVar3 = std::operator<<((ostream *)local_3cd0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
    std::operator<<(poVar3," t.media_type()==\"foo/bar\"");
    local_3cf1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3cf0);
    local_3cf1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::charset_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3d18);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3e90);
    poVar3 = std::operator<<((ostream *)local_3e90,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4c);
    std::operator<<(poVar3," t.charset()==\"\"");
    local_3eb1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3eb0);
    local_3eb1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_37b8);
  cppcms::http::content_type::content_type(local_3ec8,"foo/bar; charset=\"UTF-8");
  cppcms::http::content_type::type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_3ee8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4060);
    poVar3 = std::operator<<((ostream *)local_4060,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
    std::operator<<(poVar3," t.type()==\"foo\"");
    local_4081 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_4080);
    local_4081 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::subtype_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_40a8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4220);
    poVar3 = std::operator<<((ostream *)local_4220,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x51);
    std::operator<<(poVar3," t.subtype()==\"bar\"");
    local_4241 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_4240);
    local_4241 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::media_type_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_4268);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_43e0);
    poVar3 = std::operator<<((ostream *)local_43e0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
    std::operator<<(poVar3," t.media_type()==\"foo/bar\"");
    local_4401 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_4400);
    local_4401 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::charset_abi_cxx11_();
  bVar1 = std::operator==(in_stack_ffffffffffffb290,in_stack_ffffffffffffb288);
  std::__cxx11::string::~string(local_4428);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_45a0);
    poVar3 = std::operator<<((ostream *)local_45a0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/content_type_parser_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x53);
    std::operator<<(poVar3," t.charset()==\"\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_45c0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::http::content_type::~content_type(local_3ec8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	try {
		using cppcms::http::content_type;
		{
			content_type t("hello/world");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
		}
		{
			content_type t("Hello/WORLD; chaRset=UTF-8");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.parameter_is_set("charset"));
			TEST(!t.parameter_is_set("xx"));
			TEST(t.charset()=="UTF-8");
		}
		{
			content_type t("hello/world ; chaRset=\"UTF-8\"");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.charset()=="UTF-8");
			TEST(t.parameter_is_set("charset"));
		}
		{
			content_type t("hello/world; foo=1; bar=2; beep=\"x\\\"\"; zee=hello");
			TEST(t.type()=="hello");
			TEST(t.subtype()=="world");
			TEST(t.media_type()=="hello/world");
			TEST(t.parameter_by_key("foo")=="1");
			TEST(t.parameter_by_key("bar")=="2");
			TEST(t.parameter_by_key("beep")=="x\"");
			TEST(t.parameter_by_key("zee")=="hello");
			TEST(t.parameter_by_key("x")=="");
		}
		{
			content_type t("foo");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("foo/");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("/foo");
			TEST(t.type()=="");
			TEST(t.subtype()=="");
			TEST(t.media_type()=="");
		}
		{
			content_type t("foo/bar;; charset=UTF-8");
			TEST(t.type()=="foo");
			TEST(t.subtype()=="bar");
			TEST(t.media_type()=="foo/bar");
			TEST(t.charset()=="");
		}
		{
			content_type t("foo/bar; charset=\"UTF-8");
			TEST(t.type()=="foo");
			TEST(t.subtype()=="bar");
			TEST(t.media_type()=="foo/bar");
			TEST(t.charset()=="");
		}
		
	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}